

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC.c
# Opt level: O1

void Hacl_HMAC_compute_blake2b_32
               (uint8_t *dst,uint8_t *key,uint32_t key_len,uint8_t *data,uint32_t data_len)

{
  byte *output;
  undefined1 prev [16];
  undefined1 prev_00 [16];
  undefined1 prev_01 [16];
  undefined1 prev_02 [16];
  undefined1 prev_03 [16];
  undefined1 auVar1 [16];
  uint64_t *puVar2;
  uint32_t i;
  long lVar3;
  uint uVar4;
  uint32_t rem;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  undefined8 uVar8;
  ulong uVar9;
  byte local_3c8 [256];
  uint64_t uStack_2c8;
  uint64_t wv0 [16];
  uint64_t wv1 [16];
  uint64_t wv [16];
  uint64_t s [16];
  
  s[0xf] = 0;
  if (key_len < 0x81) {
    local_3c8[0xf8] = 0x34;
    local_3c8[0xf9] = 0x8a;
    local_3c8[0xfa] = 0x11;
    local_3c8[0xfb] = 0;
    local_3c8[0xfc] = 0;
    local_3c8[0xfd] = 0;
    local_3c8[0xfe] = 0;
    local_3c8[0xff] = 0;
    memcpy(s + 0xf,key,(ulong)key_len);
  }
  else {
    local_3c8[0xf8] = 0x50;
    local_3c8[0xf9] = 0x8a;
    local_3c8[0xfa] = 0x11;
    local_3c8[0xfb] = 0;
    local_3c8[0xfc] = 0;
    local_3c8[0xfd] = 0;
    local_3c8[0xfe] = 0;
    local_3c8[0xff] = 0;
    Hacl_Hash_Blake2b_hash_with_key((uint8_t *)(s + 0xf),0x40,key,key_len,(uint8_t *)0x0,0);
  }
  output = local_3c8 + 0x80;
  local_3c8[0xf0] = 0x36;
  local_3c8[0xf1] = 0x36;
  local_3c8[0xf2] = 0x36;
  local_3c8[0xf3] = 0x36;
  local_3c8[0xf4] = 0x36;
  local_3c8[0xf5] = 0x36;
  local_3c8[0xf6] = 0x36;
  local_3c8[0xf7] = 0x36;
  local_3c8[0xf8] = 0x36;
  local_3c8[0xf9] = 0x36;
  local_3c8[0xfa] = 0x36;
  local_3c8[0xfb] = 0x36;
  local_3c8[0xfc] = 0x36;
  local_3c8[0xfd] = 0x36;
  local_3c8[0xfe] = 0x36;
  local_3c8[0xff] = 0x36;
  local_3c8[0xe0] = 0x36;
  local_3c8[0xe1] = 0x36;
  local_3c8[0xe2] = 0x36;
  local_3c8[0xe3] = 0x36;
  local_3c8[0xe4] = 0x36;
  local_3c8[0xe5] = 0x36;
  local_3c8[0xe6] = 0x36;
  local_3c8[0xe7] = 0x36;
  local_3c8[0xe8] = 0x36;
  local_3c8[0xe9] = 0x36;
  local_3c8[0xea] = 0x36;
  local_3c8[0xeb] = 0x36;
  local_3c8[0xec] = 0x36;
  local_3c8[0xed] = 0x36;
  local_3c8[0xee] = 0x36;
  local_3c8[0xef] = 0x36;
  local_3c8[0xd0] = 0x36;
  local_3c8[0xd1] = 0x36;
  local_3c8[0xd2] = 0x36;
  local_3c8[0xd3] = 0x36;
  local_3c8[0xd4] = 0x36;
  local_3c8[0xd5] = 0x36;
  local_3c8[0xd6] = 0x36;
  local_3c8[0xd7] = 0x36;
  local_3c8[0xd8] = 0x36;
  local_3c8[0xd9] = 0x36;
  local_3c8[0xda] = 0x36;
  local_3c8[0xdb] = 0x36;
  local_3c8[0xdc] = 0x36;
  local_3c8[0xdd] = 0x36;
  local_3c8[0xde] = 0x36;
  local_3c8[0xdf] = 0x36;
  local_3c8[0xc0] = 0x36;
  local_3c8[0xc1] = 0x36;
  local_3c8[0xc2] = 0x36;
  local_3c8[0xc3] = 0x36;
  local_3c8[0xc4] = 0x36;
  local_3c8[0xc5] = 0x36;
  local_3c8[0xc6] = 0x36;
  local_3c8[199] = 0x36;
  local_3c8[200] = 0x36;
  local_3c8[0xc9] = 0x36;
  local_3c8[0xca] = 0x36;
  local_3c8[0xcb] = 0x36;
  local_3c8[0xcc] = 0x36;
  local_3c8[0xcd] = 0x36;
  local_3c8[0xce] = 0x36;
  local_3c8[0xcf] = 0x36;
  local_3c8[0xb0] = 0x36;
  local_3c8[0xb1] = 0x36;
  local_3c8[0xb2] = 0x36;
  local_3c8[0xb3] = 0x36;
  local_3c8[0xb4] = 0x36;
  local_3c8[0xb5] = 0x36;
  local_3c8[0xb6] = 0x36;
  local_3c8[0xb7] = 0x36;
  local_3c8[0xb8] = 0x36;
  local_3c8[0xb9] = 0x36;
  local_3c8[0xba] = 0x36;
  local_3c8[0xbb] = 0x36;
  local_3c8[0xbc] = 0x36;
  local_3c8[0xbd] = 0x36;
  local_3c8[0xbe] = 0x36;
  local_3c8[0xbf] = 0x36;
  local_3c8[0xa0] = 0x36;
  local_3c8[0xa1] = 0x36;
  local_3c8[0xa2] = 0x36;
  local_3c8[0xa3] = 0x36;
  local_3c8[0xa4] = 0x36;
  local_3c8[0xa5] = 0x36;
  local_3c8[0xa6] = 0x36;
  local_3c8[0xa7] = 0x36;
  local_3c8[0xa8] = 0x36;
  local_3c8[0xa9] = 0x36;
  local_3c8[0xaa] = 0x36;
  local_3c8[0xab] = 0x36;
  local_3c8[0xac] = 0x36;
  local_3c8[0xad] = 0x36;
  local_3c8[0xae] = 0x36;
  local_3c8[0xaf] = 0x36;
  local_3c8[0x90] = 0x36;
  local_3c8[0x91] = 0x36;
  local_3c8[0x92] = 0x36;
  local_3c8[0x93] = 0x36;
  local_3c8[0x94] = 0x36;
  local_3c8[0x95] = 0x36;
  local_3c8[0x96] = 0x36;
  local_3c8[0x97] = 0x36;
  local_3c8[0x98] = 0x36;
  local_3c8[0x99] = 0x36;
  local_3c8[0x9a] = 0x36;
  local_3c8[0x9b] = 0x36;
  local_3c8[0x9c] = 0x36;
  local_3c8[0x9d] = 0x36;
  local_3c8[0x9e] = 0x36;
  local_3c8[0x9f] = 0x36;
  local_3c8[0x80] = 0x36;
  local_3c8[0x81] = 0x36;
  local_3c8[0x82] = 0x36;
  local_3c8[0x83] = 0x36;
  local_3c8[0x84] = 0x36;
  local_3c8[0x85] = 0x36;
  local_3c8[0x86] = 0x36;
  local_3c8[0x87] = 0x36;
  local_3c8[0x88] = 0x36;
  local_3c8[0x89] = 0x36;
  local_3c8[0x8a] = 0x36;
  local_3c8[0x8b] = 0x36;
  local_3c8[0x8c] = 0x36;
  local_3c8[0x8d] = 0x36;
  local_3c8[0x8e] = 0x36;
  local_3c8[0x8f] = 0x36;
  lVar3 = 0;
  do {
    output[lVar3] = output[lVar3] ^ *(byte *)((long)s + lVar3 + 0x78);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  local_3c8[0x70] = 0x5c;
  local_3c8[0x71] = 0x5c;
  local_3c8[0x72] = 0x5c;
  local_3c8[0x73] = 0x5c;
  local_3c8[0x74] = 0x5c;
  local_3c8[0x75] = 0x5c;
  local_3c8[0x76] = 0x5c;
  local_3c8[0x77] = 0x5c;
  local_3c8[0x78] = 0x5c;
  local_3c8[0x79] = 0x5c;
  local_3c8[0x7a] = 0x5c;
  local_3c8[0x7b] = 0x5c;
  local_3c8[0x7c] = 0x5c;
  local_3c8[0x7d] = 0x5c;
  local_3c8[0x7e] = 0x5c;
  local_3c8[0x7f] = 0x5c;
  local_3c8[0x60] = 0x5c;
  local_3c8[0x61] = 0x5c;
  local_3c8[0x62] = 0x5c;
  local_3c8[99] = 0x5c;
  local_3c8[100] = 0x5c;
  local_3c8[0x65] = 0x5c;
  local_3c8[0x66] = 0x5c;
  local_3c8[0x67] = 0x5c;
  local_3c8[0x68] = 0x5c;
  local_3c8[0x69] = 0x5c;
  local_3c8[0x6a] = 0x5c;
  local_3c8[0x6b] = 0x5c;
  local_3c8[0x6c] = 0x5c;
  local_3c8[0x6d] = 0x5c;
  local_3c8[0x6e] = 0x5c;
  local_3c8[0x6f] = 0x5c;
  local_3c8[0x50] = 0x5c;
  local_3c8[0x51] = 0x5c;
  local_3c8[0x52] = 0x5c;
  local_3c8[0x53] = 0x5c;
  local_3c8[0x54] = 0x5c;
  local_3c8[0x55] = 0x5c;
  local_3c8[0x56] = 0x5c;
  local_3c8[0x57] = 0x5c;
  local_3c8[0x58] = 0x5c;
  local_3c8[0x59] = 0x5c;
  local_3c8[0x5a] = 0x5c;
  local_3c8[0x5b] = 0x5c;
  local_3c8[0x5c] = 0x5c;
  local_3c8[0x5d] = 0x5c;
  local_3c8[0x5e] = 0x5c;
  local_3c8[0x5f] = 0x5c;
  local_3c8[0x40] = 0x5c;
  local_3c8[0x41] = 0x5c;
  local_3c8[0x42] = 0x5c;
  local_3c8[0x43] = 0x5c;
  local_3c8[0x44] = 0x5c;
  local_3c8[0x45] = 0x5c;
  local_3c8[0x46] = 0x5c;
  local_3c8[0x47] = 0x5c;
  local_3c8[0x48] = 0x5c;
  local_3c8[0x49] = 0x5c;
  local_3c8[0x4a] = 0x5c;
  local_3c8[0x4b] = 0x5c;
  local_3c8[0x4c] = 0x5c;
  local_3c8[0x4d] = 0x5c;
  local_3c8[0x4e] = 0x5c;
  local_3c8[0x4f] = 0x5c;
  local_3c8[0x30] = 0x5c;
  local_3c8[0x31] = 0x5c;
  local_3c8[0x32] = 0x5c;
  local_3c8[0x33] = 0x5c;
  local_3c8[0x34] = 0x5c;
  local_3c8[0x35] = 0x5c;
  local_3c8[0x36] = 0x5c;
  local_3c8[0x37] = 0x5c;
  local_3c8[0x38] = 0x5c;
  local_3c8[0x39] = 0x5c;
  local_3c8[0x3a] = 0x5c;
  local_3c8[0x3b] = 0x5c;
  local_3c8[0x3c] = 0x5c;
  local_3c8[0x3d] = 0x5c;
  local_3c8[0x3e] = 0x5c;
  local_3c8[0x3f] = 0x5c;
  local_3c8[0x20] = 0x5c;
  local_3c8[0x21] = 0x5c;
  local_3c8[0x22] = 0x5c;
  local_3c8[0x23] = 0x5c;
  local_3c8[0x24] = 0x5c;
  local_3c8[0x25] = 0x5c;
  local_3c8[0x26] = 0x5c;
  local_3c8[0x27] = 0x5c;
  local_3c8[0x28] = 0x5c;
  local_3c8[0x29] = 0x5c;
  local_3c8[0x2a] = 0x5c;
  local_3c8[0x2b] = 0x5c;
  local_3c8[0x2c] = 0x5c;
  local_3c8[0x2d] = 0x5c;
  local_3c8[0x2e] = 0x5c;
  local_3c8[0x2f] = 0x5c;
  local_3c8[0x10] = 0x5c;
  local_3c8[0x11] = 0x5c;
  local_3c8[0x12] = 0x5c;
  local_3c8[0x13] = 0x5c;
  local_3c8[0x14] = 0x5c;
  local_3c8[0x15] = 0x5c;
  local_3c8[0x16] = 0x5c;
  local_3c8[0x17] = 0x5c;
  local_3c8[0x18] = 0x5c;
  local_3c8[0x19] = 0x5c;
  local_3c8[0x1a] = 0x5c;
  local_3c8[0x1b] = 0x5c;
  local_3c8[0x1c] = 0x5c;
  local_3c8[0x1d] = 0x5c;
  local_3c8[0x1e] = 0x5c;
  local_3c8[0x1f] = 0x5c;
  local_3c8[0] = 0x5c;
  local_3c8[1] = 0x5c;
  local_3c8[2] = 0x5c;
  local_3c8[3] = 0x5c;
  local_3c8[4] = 0x5c;
  local_3c8[5] = 0x5c;
  local_3c8[6] = 0x5c;
  local_3c8[7] = 0x5c;
  local_3c8[8] = 0x5c;
  local_3c8[9] = 0x5c;
  local_3c8[10] = 0x5c;
  local_3c8[0xb] = 0x5c;
  local_3c8[0xc] = 0x5c;
  local_3c8[0xd] = 0x5c;
  local_3c8[0xe] = 0x5c;
  local_3c8[0xf] = 0x5c;
  lVar3 = 0;
  do {
    local_3c8[lVar3] = local_3c8[lVar3] ^ *(byte *)((long)s + lVar3 + 0x78);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  s[0xd] = 0;
  s[0xe] = 0;
  s[0xb] = 0;
  s[0xc] = 0;
  s[9] = 0;
  s[10] = 0;
  s[7] = 0;
  s[8] = 0;
  s[5] = 0;
  s[6] = 0;
  s[3] = 0;
  s[4] = 0;
  s[1] = 0;
  s[2] = 0;
  wv[0xf] = 0;
  s[0] = 0;
  uVar8 = 0x118b17;
  Hacl_Hash_Blake2b_init(wv + 0xf,0,0x40);
  if (data_len == 0) {
    puVar2 = wv1;
    wv[0xd] = 0;
    wv[0xe] = 0;
    wv[0xb] = 0;
    wv[0xc] = 0;
    wv[9] = 0;
    wv[10] = 0;
    wv[7] = 0;
    wv[8] = 0;
    wv[5] = 0;
    wv[6] = 0;
    wv[3] = 0;
    wv[4] = 0;
    wv[1] = 0;
    wv[2] = 0;
    wv1[0xf] = 0;
    wv[0] = 0;
    uVar5 = 0x80;
    rem = 0;
    pbVar7 = output;
  }
  else {
    uVar4 = data_len & 0x7f;
    uVar5 = (data_len >> 7) - 1;
    uVar6 = uVar5;
    if (data_len < 0x80 || uVar4 != 0) {
      uVar6 = data_len >> 7;
    }
    prev_00._4_4_ = 0;
    prev_00._0_4_ = uVar6;
    uVar5 = data_len + uVar5 * -0x80;
    if (data_len < 0x80 || uVar4 != 0) {
      uVar5 = uVar4;
    }
    uVar6 = uVar6 * 0x80;
    wv[0xd] = 0;
    wv[0xe] = 0;
    wv[0xb] = 0;
    wv[0xc] = 0;
    wv[9] = 0;
    wv[10] = 0;
    wv[7] = 0;
    wv[8] = 0;
    wv[5] = 0;
    wv[6] = 0;
    wv[3] = 0;
    wv[4] = 0;
    wv[1] = 0;
    wv[2] = 0;
    wv1[0xf] = 0;
    wv[0] = 0;
    prev._8_8_ = uVar8;
    prev._0_8_ = 1;
    Hacl_Hash_Blake2b_update_multi
              (0x80,wv1 + 0xf,wv + 0xf,(FStar_UInt128_uint128)prev,(uint8_t *)0x0,0);
    wv0[0xd] = 0;
    wv0[0xe] = 0;
    wv0[0xb] = 0;
    wv0[0xc] = 0;
    wv0[9] = 0;
    wv0[10] = 0;
    wv0[7] = 0;
    wv0[8] = 0;
    wv0[5] = 0;
    wv0[6] = 0;
    wv0[3] = 0;
    wv0[4] = 0;
    wv0[1] = 0;
    wv0[2] = 0;
    uStack_2c8 = 0;
    wv0[0] = 0;
    prev_00._8_8_ = uVar8;
    Hacl_Hash_Blake2b_update_multi
              (uVar6,&uStack_2c8,wv + 0xf,(FStar_UInt128_uint128)prev_00,(uint8_t *)0x80,0);
    puVar2 = wv0;
    wv1[0xd] = 0;
    wv1[0xe] = 0;
    wv1[0xb] = 0;
    wv1[0xc] = 0;
    wv1[9] = 0;
    wv1[10] = 0;
    wv1[7] = 0;
    wv1[8] = 0;
    wv1[5] = 0;
    wv1[6] = 0;
    wv1[3] = 0;
    wv1[4] = 0;
    wv1[1] = 0;
    wv1[2] = 0;
    wv0[0xf] = 0;
    wv1[0] = 0;
    rem = uVar6 + 0x80;
    pbVar7 = data + uVar6;
  }
  prev_01._8_8_ = uVar8;
  prev_01._0_8_ = pbVar7;
  Hacl_Hash_Blake2b_update_last
            (uVar5,puVar2 + 0xf,wv + 0xf,(FStar_UInt128_uint128)prev_01,rem,(uint8_t *)0x0);
  puVar2 = wv + 0xf;
  Hacl_Hash_Blake2b_finish(0x40,output,puVar2);
  uVar9 = 0x118cc2;
  Hacl_Hash_Blake2b_init(puVar2,0,0x40);
  wv[0xd] = 0;
  wv[0xe] = 0;
  wv[0xb] = 0;
  wv[0xc] = 0;
  wv[9] = 0;
  wv[10] = 0;
  wv[7] = 0;
  wv[8] = 0;
  wv[5] = 0;
  wv[6] = 0;
  wv[3] = 0;
  wv[4] = 0;
  wv[1] = 0;
  wv[2] = 0;
  wv1[0xf] = 0;
  wv[0] = 0;
  prev_02._8_8_ = uVar9;
  prev_02._0_8_ = 1;
  Hacl_Hash_Blake2b_update_multi
            (0x80,wv1 + 0xf,puVar2,(FStar_UInt128_uint128)prev_02,(uint8_t *)0x0,0);
  wv0[0xd] = 0;
  wv0[0xe] = 0;
  wv0[0xb] = 0;
  wv0[0xc] = 0;
  wv0[9] = 0;
  wv0[10] = 0;
  wv0[7] = 0;
  wv0[8] = 0;
  wv0[5] = 0;
  wv0[6] = 0;
  wv0[3] = 0;
  wv0[4] = 0;
  wv0[1] = 0;
  wv0[2] = 0;
  uStack_2c8 = 0;
  wv0[0] = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar9;
  Hacl_Hash_Blake2b_update_multi
            (0,&uStack_2c8,puVar2,(FStar_UInt128_uint128)(auVar1 << 0x40),(uint8_t *)0x80,0);
  wv1[0xd] = 0;
  wv1[0xe] = 0;
  wv1[0xb] = 0;
  wv1[0xc] = 0;
  wv1[9] = 0;
  wv1[10] = 0;
  wv1[7] = 0;
  wv1[8] = 0;
  wv1[5] = 0;
  wv1[6] = 0;
  wv1[3] = 0;
  wv1[4] = 0;
  wv1[1] = 0;
  wv1[2] = 0;
  wv0[0xf] = 0;
  wv1[0] = 0;
  prev_03._8_8_ = uVar9;
  prev_03._0_8_ = output;
  Hacl_Hash_Blake2b_update_last
            (0x40,wv0 + 0xf,puVar2,(FStar_UInt128_uint128)prev_03,0x80,(uint8_t *)0x0);
  Hacl_Hash_Blake2b_finish(0x40,dst,puVar2);
  return;
}

Assistant:

void
Hacl_HMAC_compute_blake2b_32(
  uint8_t *dst,
  uint8_t *key,
  uint32_t key_len,
  uint8_t *data,
  uint32_t data_len
)
{
  uint32_t l = 128U;
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t key_block[l];
  memset(key_block, 0U, l * sizeof (uint8_t));
  uint8_t *nkey = key_block;
  uint32_t ite;
  if (key_len <= 128U)
  {
    ite = key_len;
  }
  else
  {
    ite = 64U;
  }
  uint8_t *zeroes = key_block + ite;
  KRML_MAYBE_UNUSED_VAR(zeroes);
  if (key_len <= 128U)
  {
    memcpy(nkey, key, key_len * sizeof (uint8_t));
  }
  else
  {
    Hacl_Hash_Blake2b_hash_with_key(nkey, 64U, key, key_len, NULL, 0U);
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t ipad[l];
  memset(ipad, 0x36U, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = ipad[i];
    uint8_t yi = key_block[i];
    ipad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t opad[l];
  memset(opad, 0x5cU, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = opad[i];
    uint8_t yi = key_block[i];
    opad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  uint64_t s[16U] = { 0U };
  Hacl_Hash_Blake2b_init(s, 0U, 64U);
  uint64_t *s0 = s;
  uint8_t *dst1 = ipad;
  if (data_len == 0U)
  {
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), 128U, ipad);
  }
  else
  {
    uint32_t block_len = 128U;
    uint32_t n_blocks0 = data_len / block_len;
    uint32_t rem0 = data_len % block_len;
    K___uint32_t_uint32_t scrut;
    if (n_blocks0 > 0U && rem0 == 0U)
    {
      uint32_t n_blocks_ = n_blocks0 - 1U;
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = data_len - n_blocks_ * block_len });
    }
    else
    {
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
    }
    uint32_t n_blocks = scrut.fst;
    uint32_t rem_len = scrut.snd;
    uint32_t full_blocks_len = n_blocks * block_len;
    uint8_t *full_blocks = data;
    uint8_t *rem = data + full_blocks_len;
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_multi(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), ipad, 1U);
    uint64_t wv0[16U] = { 0U };
    Hacl_Hash_Blake2b_update_multi(n_blocks * 128U,
      wv0,
      s0,
      FStar_UInt128_uint64_to_uint128((uint64_t)block_len),
      full_blocks,
      n_blocks);
    uint64_t wv1[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(rem_len,
      wv1,
      s0,
      FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
        FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
      rem_len,
      rem);
  }
  Hacl_Hash_Blake2b_finish(64U, dst1, s0);
  uint8_t *hash1 = ipad;
  Hacl_Hash_Blake2b_init(s0, 0U, 64U);
  uint32_t block_len = 128U;
  uint32_t n_blocks0 = 64U / block_len;
  uint32_t rem0 = 64U % block_len;
  K___uint32_t_uint32_t scrut;
  if (n_blocks0 > 0U && rem0 == 0U)
  {
    uint32_t n_blocks_ = n_blocks0 - 1U;
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = 64U - n_blocks_ * block_len });
  }
  else
  {
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
  }
  uint32_t n_blocks = scrut.fst;
  uint32_t rem_len = scrut.snd;
  uint32_t full_blocks_len = n_blocks * block_len;
  uint8_t *full_blocks = hash1;
  uint8_t *rem = hash1 + full_blocks_len;
  uint64_t wv[16U] = { 0U };
  Hacl_Hash_Blake2b_update_multi(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), opad, 1U);
  uint64_t wv0[16U] = { 0U };
  Hacl_Hash_Blake2b_update_multi(n_blocks * 128U,
    wv0,
    s0,
    FStar_UInt128_uint64_to_uint128((uint64_t)block_len),
    full_blocks,
    n_blocks);
  uint64_t wv1[16U] = { 0U };
  Hacl_Hash_Blake2b_update_last(rem_len,
    wv1,
    s0,
    FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
      FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
    rem_len,
    rem);
  Hacl_Hash_Blake2b_finish(64U, dst, s0);
}